

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall TPZMatrix<Fad<float>_>::VerifySymmetry(TPZMatrix<Fad<float>_> *this,REAL tol)

{
  TPZMatrix<Fad<float>_> *pTVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  ostream *poVar6;
  long lVar7;
  float *pfVar8;
  ulong uVar9;
  float *pfVar10;
  long lVar11;
  Fad<float> exp;
  long local_c0;
  Fad<float> local_b0;
  long local_90;
  TPZMatrix<Fad<float>_> *local_88;
  Fad<float> local_80;
  long local_60;
  REAL local_58;
  Fad<float> local_50;
  
  local_60 = (this->super_TPZBaseMatrix).fRow;
  uVar5 = 0;
  if (local_60 == (this->super_TPZBaseMatrix).fCol) {
    bVar4 = local_60 < 1;
    if (0 < local_60) {
      local_90 = 1;
      local_c0 = 0;
      local_88 = this;
      local_58 = tol;
      do {
        lVar11 = 0;
        do {
          pTVar1 = local_88;
          (*(local_88->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                    (&local_80,local_88,local_c0,lVar11);
          (*(pTVar1->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                    (&local_50,pTVar1,lVar11);
          iVar3 = local_50.dx_.num_elts;
          iVar2 = local_80.dx_.num_elts;
          local_b0.val_ = local_80.val_ - local_50.val_;
          uVar5 = local_50.dx_.num_elts;
          if (local_50.dx_.num_elts < local_80.dx_.num_elts) {
            uVar5 = local_80.dx_.num_elts;
          }
          local_b0.dx_.num_elts = 0;
          local_b0.dx_.ptr_to_data = (float *)0x0;
          if (0 < (int)uVar5) {
            uVar9 = (ulong)uVar5;
            local_b0.dx_.num_elts = uVar5;
            local_b0.dx_.ptr_to_data = (float *)operator_new__(uVar9 * 4);
            if (0 < (int)uVar5) {
              lVar7 = 0;
              do {
                pfVar8 = (float *)((long)local_80.dx_.ptr_to_data + lVar7);
                if (iVar2 == 0) {
                  pfVar8 = &local_80.defaultVal;
                }
                pfVar10 = (float *)((long)local_50.dx_.ptr_to_data + lVar7);
                if (iVar3 == 0) {
                  pfVar10 = &local_50.defaultVal;
                }
                *(float *)((long)local_b0.dx_.ptr_to_data + lVar7) = *pfVar8 - *pfVar10;
                lVar7 = lVar7 + 4;
                uVar9 = uVar9 - 1;
              } while (uVar9 != 0);
            }
          }
          local_b0.defaultVal = 0.0;
          Fad<float>::~Fad(&local_50);
          Fad<float>::~Fad(&local_80);
          if (local_58 < (double)ABS(local_b0.val_)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Elemento: ",10);
            poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
            poVar6 = std::ostream::_M_insert<long>((long)poVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  -> ",5);
            poVar6 = ::operator<<(poVar6,&local_b0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"/",1);
            (*(local_88->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                      (&local_80,local_88,local_c0,lVar11);
            poVar6 = ::operator<<(poVar6,&local_80);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
            Fad<float>::~Fad(&local_80);
            Fad<float>::~Fad(&local_b0);
            goto LAB_00c87e96;
          }
          Fad<float>::~Fad(&local_b0);
          lVar11 = lVar11 + 1;
        } while (lVar11 != local_90);
        local_c0 = local_c0 + 1;
        local_90 = local_90 + 1;
        bVar4 = local_60 <= local_c0;
      } while (local_c0 != local_60);
    }
LAB_00c87e96:
    uVar5 = (uint)bVar4;
  }
  return uVar5;
}

Assistant:

int TPZMatrix<TVar>::VerifySymmetry(REAL tol) const{
	int64_t nrows = this->Rows();
	int64_t ncols = this->Cols();
	if (nrows != ncols) return 0;
	
	for( int64_t i = 0; i < nrows; i++){
		for(int64_t j = 0; j <= i; j++){
            TVar exp = this->Get(i,j) - this->Get(j,i);
			if ( (REAL)(fabs( exp )) > tol ) {
			  	#ifdef STATE_COMPLEX
				cout << "Elemento: " << i << ", " << j << "  -> " << fabs( exp ) << "/" <<
				this->Get(i,j) << endl;
				#else
				cout << "Elemento: " << i << ", " << j << "  -> " << exp << "/" <<
				this->Get(i,j) << endl;
				#endif
				return 0;
			}
		}
	}
	return 1;
}